

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsKeyPressed(int user_key_index,bool repeat)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  byte in_SIL;
  int in_EDI;
  float t;
  ImGuiContext *g;
  int in_stack_fffffffffffffff0;
  bool local_1;
  
  if (in_EDI < 0) {
    local_1 = false;
  }
  else {
    fVar2 = (GImGui->IO).KeysDownDuration[in_EDI];
    if ((fVar2 != 0.0) || (NAN(fVar2))) {
      if (((in_SIL & 1) == 0) ||
         (pfVar1 = &(GImGui->IO).KeyRepeatDelay, fVar2 < *pfVar1 || fVar2 == *pfVar1)) {
        local_1 = false;
      }
      else {
        iVar3 = GetKeyPressedAmount(in_stack_fffffffffffffff0,(float)((ulong)GImGui >> 0x20),
                                    SUB84(GImGui,0));
        local_1 = 0 < iVar3;
      }
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ImGui::IsKeyPressed(int user_key_index, bool repeat)
{
    ImGuiContext& g = *GImGui;
    if (user_key_index < 0)
        return false;
    IM_ASSERT(user_key_index >= 0 && user_key_index < IM_ARRAYSIZE(g.IO.KeysDown));
    const float t = g.IO.KeysDownDuration[user_key_index];
    if (t == 0.0f)
        return true;
    if (repeat && t > g.IO.KeyRepeatDelay)
        return GetKeyPressedAmount(user_key_index, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate) > 0;
    return false;
}